

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O0

int Sfm_NodeResub(Sfm_Ntk_t *p,int iNode)

{
  int iVar1;
  int iVar2;
  int local_20;
  int iFanin;
  int i;
  int iNode_local;
  Sfm_Ntk_t *p_local;
  
  p->nNodesTried = p->nNodesTried + 1;
  iVar1 = Sfm_NtkCreateWindow(p,iNode,p->pPars->fVeryVerbose);
  if ((iVar1 != 0) && (iVar1 = Sfm_NtkWindowToSolver(p), iVar1 != 0)) {
    for (local_20 = 0; iVar1 = Sfm_ObjFaninNum(p,iNode), local_20 < iVar1; local_20 = local_20 + 1)
    {
      iVar1 = Sfm_ObjFanin(p,iNode,local_20);
      iVar2 = Sfm_ObjIsNode(p,iVar1);
      if (((iVar2 != 0) && (iVar1 = Sfm_ObjFanoutNum(p,iVar1), iVar1 == 1)) &&
         (iVar1 = Sfm_NodeResubSolve(p,iNode,local_20,0), iVar1 != 0)) {
        return 1;
      }
    }
    if (p->pPars->fArea == 0) {
      for (local_20 = 0; iVar1 = Sfm_ObjFaninNum(p,iNode), local_20 < iVar1; local_20 = local_20 + 1
          ) {
        iVar1 = Sfm_ObjFanin(p,iNode,local_20);
        iVar2 = Sfm_ObjIsNode(p,iVar1);
        if (((iVar2 == 0) || (iVar1 = Sfm_ObjFanoutNum(p,iVar1), iVar1 != 1)) &&
           (iVar1 = Sfm_NodeResubSolve(p,iNode,local_20,1), iVar1 != 0)) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Sfm_NodeResub( Sfm_Ntk_t * p, int iNode )
{
    int i, iFanin;
    p->nNodesTried++;
    // prepare SAT solver
    if ( !Sfm_NtkCreateWindow( p, iNode, p->pPars->fVeryVerbose ) )
        return 0;
    if ( !Sfm_NtkWindowToSolver( p ) )
        return 0;
    // try replacing area critical fanins
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
        if ( Sfm_ObjIsNode(p, iFanin) && Sfm_ObjFanoutNum(p, iFanin) == 1 )
        {
            if ( Sfm_NodeResubSolve( p, iNode, i, 0 ) )
                return 1;
        }
    if ( p->pPars->fArea )
        return 0;
    // try removing redundant edges
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
        if ( !(Sfm_ObjIsNode(p, iFanin) && Sfm_ObjFanoutNum(p, iFanin) == 1) )
        {
            if ( Sfm_NodeResubSolve( p, iNode, i, 1 ) )
                return 1;
        }
/*
    // try replacing area critical fanins while adding two new fanins
    if ( Sfm_ObjFaninNum(p, iNode) < p->nFaninMax )
        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
            {
                if ( Abc_NtkMfsSolveSatResub2( p, pNode, i, -1 ) )
                    return 1;
            }
*/
    return 0;
}